

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O1

void __thiscall
flatbuffers::swift::SwiftGenerator::BuildUnionEnumSwitchCase
          (SwiftGenerator *this,EnumDef *ed,string *field,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *buffer_constructor,string *indentation,bool is_vector)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  CodeWriter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  EnumVal *pEVar4;
  mapped_type *pmVar5;
  long *plVar6;
  undefined8 *puVar7;
  undefined8 uVar8;
  long *plVar9;
  ulong *puVar10;
  size_type *psVar11;
  pointer ppEVar12;
  int iVar13;
  ulong uVar14;
  char cVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> constructor;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_3;
  string variant;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  EnumVal ev;
  string ns_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  ulong *local_300;
  long local_2f8;
  ulong local_2f0;
  long lStack_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  string local_2c0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_2a0;
  string *local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  long *local_270;
  long local_268;
  long local_260;
  long lStack_258;
  long *local_250;
  long local_248;
  long local_240;
  ulong uStack_238;
  string local_230;
  string local_210;
  string *local_1f0;
  SwiftGenerator *local_1e8;
  char *local_1e0;
  EnumDef *local_1d8;
  long *local_1d0 [2];
  long local_1c0 [2];
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  long lStack_198;
  long *local_190;
  long local_188;
  long local_180;
  long lStack_178;
  EnumVal local_170;
  char *local_c8;
  char *local_c0;
  IdlNamer *local_b8;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  local_b8 = &this->namer_;
  local_2a0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              buffer_constructor;
  local_298 = indentation;
  local_1f0 = field;
  local_1d8 = ed;
  IdlNamer::NamespacedType_abi_cxx11_(&local_b0,local_b8,&ed->super_Definition);
  paVar1 = &local_170.name.field_2;
  local_170.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"VALUETYPE","");
  this_00 = &this->code_;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_00->value_map_,&local_170.name);
  std::__cxx11::string::_M_assign((string *)pmVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_170.name._M_dataplus._M_p,local_170.name.field_2._M_allocated_capacity + 1
                   );
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"{{ACCESS_TYPE}} var {{FIELDVAR}}: \\","");
  CodeWriter::operator+=(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  iVar13 = 0x3854e7;
  if (is_vector) {
    iVar13 = 0x3854d1;
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,iVar13,iVar13 + (uint)is_vector * 2 + 0x13);
  CodeWriter::operator+=(this_00,&local_70);
  local_1e8 = this;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_1e0 = "(at: index";
  if (!is_vector) {
    local_1e0 = "";
  }
  pcVar3 = (local_298->_M_dataplus)._M_p;
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_320,pcVar3,pcVar3 + local_298->_M_string_length);
  std::__cxx11::string::append((char *)&local_320);
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_320,(ulong)(local_1f0->_M_dataplus)._M_p);
  local_250 = &local_240;
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_240 = *plVar9;
    uStack_238 = plVar6[3];
  }
  else {
    local_240 = *plVar9;
    local_250 = (long *)*plVar6;
  }
  local_248 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_250);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  puVar10 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_210.field_2._M_allocated_capacity = *puVar10;
    local_210.field_2._8_8_ = plVar6[3];
  }
  else {
    local_210.field_2._M_allocated_capacity = *puVar10;
    local_210._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_210._M_string_length = plVar6[1];
  *plVar6 = (long)puVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_210);
  psVar11 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_2c0.field_2._M_allocated_capacity = *psVar11;
    local_2c0.field_2._8_8_ = puVar7[3];
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  }
  else {
    local_2c0.field_2._M_allocated_capacity = *psVar11;
    local_2c0._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_2c0._M_string_length = puVar7[1];
  *puVar7 = psVar11;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2c0);
  psVar11 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_230.field_2._M_allocated_capacity = *psVar11;
    local_230.field_2._8_8_ = plVar6[3];
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  }
  else {
    local_230.field_2._M_allocated_capacity = *psVar11;
    local_230._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_230._M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_230);
  psVar11 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_170.name.field_2._M_allocated_capacity = *psVar11;
    local_170.name.field_2._8_8_ = plVar6[3];
    local_170.name._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_170.name.field_2._M_allocated_capacity = *psVar11;
    local_170.name._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_170.name._M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(local_2a0,&local_170.name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_170.name._M_dataplus._M_p,local_170.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if (local_250 != &local_240) {
    operator_delete(local_250,local_240 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  ppEVar12 = (local_1d8->vals).vec.
             super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppEVar12 <
      (local_1d8->vals).vec.
      super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar1 = &local_2e0.field_2;
    local_c0 = "(";
    if (is_vector) {
      local_c0 = "";
    }
    local_c8 = ", ";
    if (!is_vector) {
      local_c8 = "";
    }
    paVar2 = &local_290.field_2;
    do {
      pEVar4 = *ppEVar12;
      local_170.name._M_dataplus._M_p = (pointer)&local_170.name.field_2;
      pcVar3 = (pEVar4->name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_170,pcVar3,pcVar3 + (pEVar4->name)._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_170.doc_comment,&pEVar4->doc_comment);
      local_170.union_type.base_type = (pEVar4->union_type).base_type;
      local_170.union_type.element = (pEVar4->union_type).element;
      local_170.union_type.struct_def = (pEVar4->union_type).struct_def;
      local_170.union_type.enum_def = (pEVar4->union_type).enum_def;
      local_170.union_type.fixed_length = (pEVar4->union_type).fixed_length;
      local_170.union_type._26_6_ = *(undefined6 *)&(pEVar4->union_type).field_0x1a;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                  *)&local_170.attributes,
                 (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                  *)&pEVar4->attributes);
      std::vector<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>::vector
                (&local_170.attributes.vec,&(pEVar4->attributes).vec);
      local_170.value = pEVar4->value;
      IdlNamer::LegacySwiftVariant_abi_cxx11_(&local_230,local_b8,&local_170);
      if (local_170.union_type.base_type != BASE_TYPE_NONE) {
        if (local_170.union_type.base_type == BASE_TYPE_STRUCT) {
          cVar15 = (local_170.union_type.struct_def)->fixed;
        }
        else {
          cVar15 = '\0';
        }
        if (cVar15 == '\0') {
          GenType_abi_cxx11_(&local_2c0,local_1e8,&local_170.union_type,false);
        }
        else {
          GenType_abi_cxx11_(&local_210,local_1e8,&local_170.union_type,false);
          local_250 = &local_240;
          local_240 = 0x656c626174754d5f;
          local_248 = 8;
          uStack_238 = uStack_238 & 0xffffffffffffff00;
          uVar8 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            uVar8 = local_210.field_2._M_allocated_capacity;
          }
          if ((local_210._M_string_length + 8 < 0x10) &&
             ((ulong)uVar8 < local_210._M_string_length + 8)) {
            puVar7 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_250,0,(char *)0x0,(ulong)local_210._M_dataplus._M_p);
          }
          else {
            puVar7 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_210,(ulong)&local_240);
          }
          local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
          psVar11 = puVar7 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_2c0.field_2._M_allocated_capacity = *psVar11;
            local_2c0.field_2._8_8_ = puVar7[3];
          }
          else {
            local_2c0.field_2._M_allocated_capacity = *psVar11;
            local_2c0._M_dataplus._M_p = (pointer)*puVar7;
          }
          local_2c0._M_string_length = puVar7[1];
          *puVar7 = psVar11;
          puVar7[1] = 0;
          *(undefined1 *)psVar11 = 0;
        }
        if (cVar15 != '\0') {
          if (local_250 != &local_240) {
            operator_delete(local_250,local_240 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          }
        }
        pcVar3 = (local_298->_M_dataplus)._M_p;
        local_300 = &local_2f0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_300,pcVar3,pcVar3 + local_298->_M_string_length);
        std::__cxx11::string::append((char *)&local_300);
        plVar6 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_300,(ulong)local_230._M_dataplus._M_p);
        psVar11 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_2e0.field_2._M_allocated_capacity = *psVar11;
          local_2e0.field_2._8_8_ = plVar6[3];
          local_2e0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_2e0.field_2._M_allocated_capacity = *psVar11;
          local_2e0._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_2e0._M_string_length = plVar6[1];
        *plVar6 = (long)psVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_2e0);
        psVar11 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_320.field_2._M_allocated_capacity = *psVar11;
          local_320.field_2._8_8_ = plVar6[3];
          local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
        }
        else {
          local_320.field_2._M_allocated_capacity = *psVar11;
          local_320._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_320._M_string_length = plVar6[1];
        *plVar6 = (long)psVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_2a0,&local_320);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != paVar1) {
          operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
        }
        if (local_300 != &local_2f0) {
          operator_delete(local_300,local_2f0 + 1);
        }
        local_1d0[0] = local_1c0;
        pcVar3 = (local_298->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1d0,pcVar3,pcVar3 + local_298->_M_string_length);
        std::__cxx11::string::append((char *)local_1d0);
        plVar6 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_1d0,(ulong)(local_1f0->_M_dataplus)._M_p);
        local_1b0 = &local_1a0;
        plVar9 = plVar6 + 2;
        if ((long *)*plVar6 == plVar9) {
          local_1a0 = *plVar9;
          lStack_198 = plVar6[3];
        }
        else {
          local_1a0 = *plVar9;
          local_1b0 = (long *)*plVar6;
        }
        local_1a8 = plVar6[1];
        *plVar6 = (long)plVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_1b0);
        local_190 = &local_180;
        plVar9 = plVar6 + 2;
        if ((long *)*plVar6 == plVar9) {
          local_180 = *plVar9;
          lStack_178 = plVar6[3];
        }
        else {
          local_180 = *plVar9;
          local_190 = (long *)*plVar6;
        }
        local_188 = plVar6[1];
        *plVar6 = (long)plVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_190);
        puVar10 = (ulong *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar10) {
          local_290.field_2._M_allocated_capacity = *puVar10;
          local_290.field_2._8_8_ = plVar6[3];
          local_290._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_290.field_2._M_allocated_capacity = *puVar10;
          local_290._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_290._M_string_length = plVar6[1];
        *plVar6 = (long)puVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_290);
        local_270 = &local_260;
        plVar9 = plVar6 + 2;
        if ((long *)*plVar6 == plVar9) {
          local_260 = *plVar9;
          lStack_258 = plVar6[3];
        }
        else {
          local_260 = *plVar9;
          local_270 = (long *)*plVar6;
        }
        local_268 = plVar6[1];
        *plVar6 = (long)plVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_270);
        puVar10 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar10) {
          local_2f0 = *puVar10;
          lStack_2e8 = plVar6[3];
          local_300 = &local_2f0;
        }
        else {
          local_2f0 = *puVar10;
          local_300 = (ulong *)*plVar6;
        }
        local_2f8 = plVar6[1];
        *plVar6 = (long)puVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_300,(ulong)local_2c0._M_dataplus._M_p);
        psVar11 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_2e0.field_2._M_allocated_capacity = *psVar11;
          local_2e0.field_2._8_8_ = plVar6[3];
          local_2e0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_2e0.field_2._M_allocated_capacity = *psVar11;
          local_2e0._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_2e0._M_string_length = plVar6[1];
        *plVar6 = (long)psVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_2e0);
        local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
        psVar11 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_320.field_2._M_allocated_capacity = *psVar11;
          local_320.field_2._8_8_ = plVar6[3];
        }
        else {
          local_320.field_2._M_allocated_capacity = *psVar11;
          local_320._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_320._M_string_length = plVar6[1];
        *plVar6 = (long)psVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_2a0,&local_320);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != paVar1) {
          operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
        }
        if (local_300 != &local_2f0) {
          operator_delete(local_300,local_2f0 + 1);
        }
        if (local_270 != &local_260) {
          operator_delete(local_270,local_260 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != paVar2) {
          operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
        }
        if (local_190 != &local_180) {
          operator_delete(local_190,local_180 + 1);
        }
        if (local_1b0 != &local_1a0) {
          operator_delete(local_1b0,local_1a0 + 1);
        }
        if (local_1d0[0] != local_1c0) {
          operator_delete(local_1d0[0],local_1c0[0] + 1);
        }
        local_300 = &local_2f0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_300,local_b0._M_dataplus._M_p,
                   local_b0._M_dataplus._M_p + local_b0._M_string_length);
        std::__cxx11::string::append((char *)&local_300);
        plVar6 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_300,(ulong)local_230._M_dataplus._M_p);
        psVar11 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_2e0.field_2._M_allocated_capacity = *psVar11;
          local_2e0.field_2._8_8_ = plVar6[3];
          local_2e0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_2e0.field_2._M_allocated_capacity = *psVar11;
          local_2e0._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_2e0._M_string_length = plVar6[1];
        *plVar6 = (long)psVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_2e0);
        local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
        psVar11 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_320.field_2._M_allocated_capacity = *psVar11;
          local_320.field_2._8_8_ = plVar6[3];
        }
        else {
          local_320.field_2._M_allocated_capacity = *psVar11;
          local_320._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_320._M_string_length = plVar6[1];
        *plVar6 = (long)psVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != paVar1) {
          operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
        }
        if (local_300 != &local_2f0) {
          operator_delete(local_300,local_2f0 + 1);
        }
        local_270 = &local_260;
        pcVar3 = (local_298->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_270,pcVar3,pcVar3 + local_298->_M_string_length);
        std::__cxx11::string::append((char *)&local_270);
        plVar6 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_270,(ulong)(local_1f0->_M_dataplus)._M_p);
        puVar10 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar10) {
          local_2f0 = *puVar10;
          lStack_2e8 = plVar6[3];
          local_300 = &local_2f0;
        }
        else {
          local_2f0 = *puVar10;
          local_300 = (ulong *)*plVar6;
        }
        local_2f8 = plVar6[1];
        *plVar6 = (long)puVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if (is_vector) {
          std::operator+(&local_90,".append(",&local_320);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
          puVar10 = (ulong *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar10) {
            local_290.field_2._M_allocated_capacity = *puVar10;
            local_290.field_2._8_8_ = plVar6[3];
            local_290._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_290.field_2._M_allocated_capacity = *puVar10;
            local_290._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_290._M_string_length = plVar6[1];
          *plVar6 = (long)puVar10;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
        }
        else {
          std::operator+(&local_290," = ",&local_320);
        }
        uVar14 = 0xf;
        if (local_300 != &local_2f0) {
          uVar14 = local_2f0;
        }
        if (uVar14 < local_290._M_string_length + local_2f8) {
          uVar8 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p != paVar2) {
            uVar8 = local_290.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar8 < local_290._M_string_length + local_2f8) goto LAB_002fe279;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_300);
        }
        else {
LAB_002fe279:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_300,(ulong)local_290._M_dataplus._M_p);
        }
        psVar11 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_2e0.field_2._M_allocated_capacity = *psVar11;
          local_2e0.field_2._8_8_ = puVar7[3];
          local_2e0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_2e0.field_2._M_allocated_capacity = *psVar11;
          local_2e0._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_2e0._M_string_length = puVar7[1];
        *puVar7 = psVar11;
        puVar7[1] = 0;
        *(undefined1 *)psVar11 = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_2a0,&local_2e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != paVar1) {
          operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != paVar2) {
          operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
        }
        if ((is_vector) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2)) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if (local_300 != &local_2f0) {
          operator_delete(local_300,local_2f0 + 1);
        }
        if (local_270 != &local_260) {
          operator_delete(local_270,local_260 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      SymbolTable<flatbuffers::Value>::~SymbolTable(&local_170.attributes);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_170.doc_comment);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170.name._M_dataplus._M_p != &local_170.name.field_2) {
        operator_delete(local_170.name._M_dataplus._M_p,
                        local_170.name.field_2._M_allocated_capacity + 1);
      }
      ppEVar12 = ppEVar12 + 1;
    } while (ppEVar12 <
             (local_1d8->vals).vec.
             super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  paVar1 = &local_170.name.field_2;
  pcVar3 = (local_298->_M_dataplus)._M_p;
  local_170.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,pcVar3,pcVar3 + local_298->_M_string_length);
  std::__cxx11::string::append((char *)&local_170);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(local_2a0,&local_170.name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_170.name._M_dataplus._M_p,local_170.name.field_2._M_allocated_capacity + 1
                   );
  }
  pcVar3 = (local_298->_M_dataplus)._M_p;
  local_170.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,pcVar3,pcVar3 + local_298->_M_string_length);
  std::__cxx11::string::append((char *)&local_170);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(local_2a0,&local_170.name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_170.name._M_dataplus._M_p,local_170.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void BuildUnionEnumSwitchCase(const EnumDef &ed, const std::string &field,
                                std::vector<std::string> &buffer_constructor,
                                const std::string &indentation = "",
                                const bool is_vector = false) {
    const auto ns_type = namer_.NamespacedType(ed);
    code_.SetValue("VALUETYPE", ns_type);
    code_ += "{{ACCESS_TYPE}} var {{FIELDVAR}}: \\";
    code_ += is_vector ? "[{{VALUETYPE}}Union?]" : "{{VALUETYPE}}Union?";

    const auto vector_reader = is_vector ? "(at: index" : "";
    buffer_constructor.push_back(indentation + "switch _t." + field + "Type" +
                                 vector_reader + (is_vector ? ")" : "") + " {");

    for (auto it = ed.Vals().begin(); it < ed.Vals().end(); ++it) {
      const auto ev = **it;
      const auto variant = namer_.LegacySwiftVariant(ev);
      if (ev.union_type.base_type == BASE_TYPE_NONE) { continue; }
      const auto type = IsStruct(ev.union_type)
                            ? GenType(ev.union_type) + Mutable()
                            : GenType(ev.union_type);
      buffer_constructor.push_back(indentation + "case ." + variant + ":");
      buffer_constructor.push_back(
          indentation + "  var _v = _t." + field + (is_vector ? "" : "(") +
          vector_reader + (is_vector ? ", " : "") + "type: " + type + ".self)");
      const auto constructor =
          ns_type + "Union(_v?.unpack(), type: ." + variant + ")";
      buffer_constructor.push_back(
          indentation + "  " + field +
          (is_vector ? ".append(" + constructor + ")" : " = " + constructor));
    }
    buffer_constructor.push_back(indentation + "default: break");
    buffer_constructor.push_back(indentation + "}");
  }